

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int full_pixel_diamond(FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
                      int *cost_list,FULLPEL_MV *best_mv,FULLPEL_MV_STATS *best_mv_stats,
                      FULLPEL_MV *second_best_mv)

{
  long lVar1;
  FULLPEL_MOTION_SEARCH_PARAMS *pFVar2;
  int iVar3;
  int iVar4;
  int *in_RCX;
  int in_EDX;
  buf_2d *in_RSI;
  undefined4 in_EDI;
  undefined4 *in_R8;
  undefined8 *in_R9;
  FULLPEL_MV *unaff_retaddr;
  MV_COST_PARAMS *in_stack_00000008;
  int in_stack_00000014;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_00000018;
  uint in_stack_00000020;
  FULLPEL_MV in_stack_00000024;
  FULLPEL_MV *in_stack_00000030;
  int costlist_has_sad;
  FULLPEL_MV_STATS tmp_best_mv_stats;
  FULLPEL_MV tmp_best_mv;
  int further_steps;
  int bestsme;
  uint start_mv_sad;
  int num00;
  int n;
  int thissme;
  search_site_config *cfg;
  FULLPEL_MV this_mv_2;
  int idx;
  MV_COST_PARAMS *mv_cost_params;
  FULLPEL_MV this_mv_1;
  int i_1;
  FULLPEL_MV this_mv;
  int i;
  int bc;
  int br;
  int ref_stride;
  buf_2d *ref;
  buf_2d *src;
  FullMvLimits *in_stack_fffffffffffffef8;
  MV_COST_PARAMS *mv_cost_params_00;
  buf_2d *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  buf_2d *pbVar5;
  uint8_t *in_stack_ffffffffffffff10;
  FULLPEL_MOTION_SEARCH_PARAMS *pFVar6;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffff18;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffff20;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  int local_ac;
  int local_a0;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int local_5c;
  FULLPEL_MV local_4c;
  int local_48;
  int local_40;
  short local_4;
  short sStack_2;
  
  lVar1 = *(long *)&in_RSI[2].width;
  clamp_fullmv((FULLPEL_MV *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  get_start_mvpred_sad_cost
            (in_stack_ffffffffffffff18,SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0));
  mv_cost_params_00 = in_stack_00000008;
  diamond_search_sad(in_stack_00000024,in_stack_00000020,in_stack_00000018,in_stack_00000014,
                     (int *)in_stack_00000008,unaff_retaddr,in_stack_00000030);
  local_ac = get_mvpred_compound_var_cost
                       ((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(in_EDI,in_stack_ffffffffffffff98),
                        (FULLPEL_MV *)in_RSI,
                        (FULLPEL_MV_STATS *)CONCAT44(in_EDX,in_stack_ffffffffffffff88));
  iVar3 = (*(int *)(lVar1 + 0xbb0) + -1) - in_EDX;
  while (local_a0 < iVar3) {
    local_a0 = local_a0 + 1;
    mv_cost_params_00 = in_stack_00000008;
    diamond_search_sad(in_stack_00000024,in_stack_00000020,in_stack_00000018,in_stack_00000014,
                       (int *)in_stack_00000008,unaff_retaddr,in_stack_00000030);
    iVar4 = get_mvpred_compound_var_cost
                      ((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(in_EDI,in_stack_ffffffffffffff98),
                       (FULLPEL_MV *)in_RSI,
                       (FULLPEL_MV_STATS *)CONCAT44(in_EDX,in_stack_ffffffffffffff88));
    if (iVar4 < local_ac) {
      *in_R8 = local_b4;
      *in_R9 = local_c0;
      *(undefined4 *)(in_R9 + 1) = local_b8;
      local_ac = iVar4;
    }
  }
  if (in_RCX != (int *)0x0) {
    pFVar2 = *(FULLPEL_MOTION_SEARCH_PARAMS **)&in_RSI->stride;
    local_4 = (short)*in_R8;
    sStack_2 = (short)((uint)*in_R8 >> 0x10);
    get_buf_from_fullmv(in_stack_ffffffffffffff00,(FULLPEL_MV *)mv_cost_params_00);
    iVar3 = get_mvpred_sad(in_stack_ffffffffffffff20,(buf_2d *)in_stack_ffffffffffffff18,
                           in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20)
                          );
    *in_RCX = iVar3;
    iVar3 = check_bounds((FullMvLimits *)&in_RSI[2].stride,(int)local_4,(int)sStack_2,1);
    if (iVar3 == 0) {
      for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
        local_4c.col = sStack_2 + *(short *)(calc_int_sad_list_neighbors + (long)local_48 * 4 + 2);
        local_4c.row = local_4 + *(short *)(calc_int_sad_list_neighbors + (long)local_48 * 4);
        iVar3 = av1_is_fullmv_in_range((FullMvLimits *)&in_RSI[2].stride,local_4c);
        if (iVar3 == 0) {
          in_RCX[local_48 + 1] = 0x7fffffff;
        }
        else {
          pbVar5 = in_RSI;
          pFVar6 = pFVar2;
          get_buf_from_fullmv(in_stack_ffffffffffffff00,(FULLPEL_MV *)mv_cost_params_00);
          iVar3 = get_mvpred_sad(in_stack_ffffffffffffff20,(buf_2d *)in_stack_ffffffffffffff18,
                                 &pFVar6->bsize,(int)((ulong)pbVar5 >> 0x20));
          in_RCX[local_48 + 1] = iVar3;
        }
      }
    }
    else {
      for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
        pbVar5 = in_RSI;
        pFVar6 = pFVar2;
        get_buf_from_fullmv(in_stack_ffffffffffffff00,(FULLPEL_MV *)mv_cost_params_00);
        iVar3 = get_mvpred_sad(pFVar6,pbVar5,in_stack_ffffffffffffff10,
                               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        in_RCX[local_40 + 1] = iVar3;
      }
    }
    iVar3 = mvsad_err_cost_((FULLPEL_MV *)in_stack_ffffffffffffff00,mv_cost_params_00);
    *in_RCX = iVar3 + *in_RCX;
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      if (in_RCX[local_5c + 1] != 0x7fffffff) {
        iVar3 = mvsad_err_cost_((FULLPEL_MV *)in_stack_ffffffffffffff00,mv_cost_params_00);
        in_RCX[local_5c + 1] = iVar3 + in_RCX[local_5c + 1];
      }
    }
  }
  return local_ac;
}

Assistant:

static int full_pixel_diamond(FULLPEL_MV start_mv,
                              const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                              const int step_param, int *cost_list,
                              FULLPEL_MV *best_mv,
                              FULLPEL_MV_STATS *best_mv_stats,
                              FULLPEL_MV *second_best_mv) {
  const search_site_config *cfg = ms_params->search_sites;
  int thissme, n, num00 = 0;

  // Clamp start mv and calculate the cost
  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  unsigned int start_mv_sad = get_start_mvpred_sad_cost(ms_params, start_mv);

  diamond_search_sad(start_mv, start_mv_sad, ms_params, step_param, &n, best_mv,
                     second_best_mv);

  int bestsme = get_mvpred_compound_var_cost(ms_params, best_mv, best_mv_stats);

  // If there won't be more n-step search, check to see if refining search is
  // needed.
  const int further_steps = cfg->num_search_steps - 1 - step_param;
  while (n < further_steps) {
    ++n;

    // TODO(chiyotsai@google.com): There is another bug here where the second
    // best mv gets incorrectly overwritten. Fix it later.
    FULLPEL_MV tmp_best_mv;
    FULLPEL_MV_STATS tmp_best_mv_stats;
    diamond_search_sad(start_mv, start_mv_sad, ms_params, step_param + n,
                       &num00, &tmp_best_mv, second_best_mv);

    thissme = get_mvpred_compound_var_cost(ms_params, &tmp_best_mv,
                                           &tmp_best_mv_stats);

    if (thissme < bestsme) {
      bestsme = thissme;
      *best_mv = tmp_best_mv;
      *best_mv_stats = tmp_best_mv_stats;
    }

    if (num00) {
      // Advance the loop by num00 steps
      n += num00;
      num00 = 0;
    }
  }

  // Return cost list.
  if (cost_list) {
    if (USE_SAD_COSTLIST) {
      const int costlist_has_sad = 0;
      calc_int_sad_list(*best_mv, ms_params, cost_list, costlist_has_sad);
    } else {
      calc_int_cost_list(*best_mv, ms_params, cost_list);
    }
  }
  return bestsme;
}